

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Box * BoxNesting::Parser::parseBoxSpecification(istream *inputStream)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  istream *in_RSI;
  Box *in_RDI;
  stringstream ss_1;
  out_of_range *e;
  float z;
  float y;
  float x;
  stringstream ss;
  smatch match;
  string inputLine;
  string *in_stack_fffffffffffffab8;
  string *in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  match_flag_type in_stack_fffffffffffffacc;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffad0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae0;
  flag_type in_stack_fffffffffffffaf4;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  array<float,_3UL> *in_stack_fffffffffffffcc8;
  Box *in_stack_fffffffffffffcd0;
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  float local_218;
  float local_214;
  float local_210;
  undefined1 local_209;
  stringstream local_1e8 [16];
  ostream local_1d8 [424];
  string local_30 [32];
  istream *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_30);
  if (parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 (char *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseBoxSpecification(std::istream&)::boxRegex_abi_cxx11_);
    }
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffac0);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                     in_stack_fffffffffffffacc);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1e8);
    poVar3 = std::operator<<(local_1d8,
                             "Expected a box specification in the form of \"x.x y.y z.z\". Got: \"")
    ;
    poVar3 = std::operator<<(poVar3,local_30);
    std::operator<<(poVar3,"\"");
    local_209 = 1;
    uVar4 = __cxa_allocate_exception(0x18);
    std::__cxx11::stringstream::str();
    ParserError::ParserError((ParserError *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_209 = 0;
    __cxa_throw(uVar4,&ParserError::typeinfo,ParserError::~ParserError);
  }
  local_210 = 0.0;
  local_214 = 0.0;
  local_218 = 0.0;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffffad0,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(in_stack_fffffffffffffaf8);
  local_210 = std::__cxx11::stof(in_stack_fffffffffffffac0,(size_t *)in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffffad0,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(in_stack_fffffffffffffaf8);
  local_214 = std::__cxx11::stof(in_stack_fffffffffffffac0,(size_t *)in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffffad0,
               CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(in_stack_fffffffffffffaf8);
  local_218 = std::__cxx11::stof(in_stack_fffffffffffffac0,(size_t *)in_stack_fffffffffffffab8);
  std::__cxx11::string::~string(local_278);
  Box::Box(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x109493);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

Box Parser::parseBoxSpecification(std::istream& inputStream)
{
	std::string inputLine;
	std::getline(inputStream, inputLine);

	static const std::regex boxRegex(R"(\s*(\d*.\d+)\s+(\d*.\d+)\s+(\d*.\d+))");
	std::smatch match;

	if (!std::regex_match(inputLine, match, boxRegex)) {
		std::stringstream ss;
		ss << R"(Expected a box specification in the form of "x.x y.y z.z". Got: ")" << inputLine << "\"";
		throw ParserError(ss.str());
	}

	float x = 0;
	float y = 0;
	float z = 0;

	try {
		x = std::stof(match[1].str());
		y = std::stof(match[2].str());
		z = std::stof(match[3].str());
	} catch (const std::out_of_range& e) {
		std::stringstream ss;
		ss << "x, y or z length of box is out of range of floats range, got x: " << match[1].str()
		   << ", y: " << match[2].str() << ", z: " << match[3].str();
		throw ParserError(ss.str(), e);
	}

	return Box({x, y, z});
}